

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Torsion.hpp
# Opt level: O0

string * __thiscall OpenMD::Torsion::getName_abi_cxx11_(Torsion *this)

{
  long in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string((string *)in_RDI,(string *)(in_RSI + 0x70));
  return in_RDI;
}

Assistant:

virtual std::string getName() { return name_; }